

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

char * mpp_get_mpp_service_name(void)

{
  int iVar1;
  undefined8 local_10;
  
  if (mpp_get_mpp_service_name::mpp_service_name == (char *)0x0) {
    iVar1 = access(mpp_get_mpp_service_name::mpp_service_dev[0],6);
    if (iVar1 == 0) {
      mpp_get_mpp_service_name::mpp_service_name = mpp_get_mpp_service_name::mpp_service_dev[0];
    }
    else {
      iVar1 = access(mpp_get_mpp_service_name::mpp_service_dev[1],6);
      if (iVar1 == 0) {
        mpp_get_mpp_service_name::mpp_service_name = mpp_get_mpp_service_name::mpp_service_dev[1];
      }
    }
    local_10 = mpp_get_mpp_service_name::mpp_service_name;
  }
  else {
    local_10 = mpp_get_mpp_service_name::mpp_service_name;
  }
  mpp_get_mpp_service_name::mpp_service_name = local_10;
  return local_10;
}

Assistant:

const char *mpp_get_mpp_service_name(void)
{
    static const char *mpp_service_name = NULL;
    static const char *mpp_service_dev[] = {
        "/dev/mpp_service",
        "/dev/mpp-service",
    };

    if (mpp_service_name)
        return mpp_service_name;

    if (!access(mpp_service_dev[0], F_OK | R_OK | W_OK)) {
        mpp_service_name = mpp_service_dev[0];
    } else if (!access(mpp_service_dev[1], F_OK | R_OK | W_OK))
        mpp_service_name = mpp_service_dev[1];

    return mpp_service_name;
}